

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O0

void sm3(void *in,unsigned_long inlen,void *out)

{
  undefined1 local_108 [8];
  sm3_context ctx;
  void *out_local;
  unsigned_long inlen_local;
  void *in_local;
  
  ctx.opad._56_8_ = out;
  sm3_init((sm3_context *)local_108);
  sm3_update((sm3_context *)local_108,(uint8_t *)in,inlen);
  sm3_final((sm3_context *)local_108,(uint8_t *)ctx.opad._56_8_);
  return;
}

Assistant:

void sm3(const void *in, unsigned long inlen, void* out)
{
	struct sm3_context ctx;
	sm3_init(&ctx);
	sm3_update(&ctx, (const uint8_t *)in, (size_t)inlen);
	sm3_final(&ctx, (uint8_t*)out);
}